

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::
ImmutableMessageOneofFieldLiteGenerator
          (ImmutableMessageOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  
  ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator
            (&this->super_ImmutableMessageFieldLiteGenerator,descriptor,messageBitIndex,context);
  (this->super_ImmutableMessageFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  _vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMessageOneofFieldLiteGenerator_0047aa98;
  info = Context::GetOneofGeneratorInfo(context,*(OneofDescriptor **)(descriptor + 0x58));
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutableMessageFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutableMessageOneofFieldLiteGenerator::
    ImmutableMessageOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                            int messageBitIndex,
                                            Context* context)
    : ImmutableMessageFieldLiteGenerator(descriptor, messageBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}